

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O1

CURLcode recvbuf_write_hds(Curl_cfilter *cf,Curl_easy *data,char *buf,size_t blen)

{
  ssize_t sVar1;
  char *pcVar2;
  CURLcode result;
  CURLcode local_c;
  
  if (cf[9].conn == (connectdata *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    pcVar2 = ((cf[9].conn)->host).rawalloc;
  }
  sVar1 = Curl_bufq_write((bufq *)(pcVar2 + 8),(uchar *)data,(size_t)buf,&local_c);
  if (-1 < sVar1) {
    *(long *)(pcVar2 + 0x110) = *(long *)(pcVar2 + 0x110) + sVar1;
    local_c = CURLE_OK;
  }
  return local_c;
}

Assistant:

static CURLcode recvbuf_write_hds(struct Curl_cfilter *cf,
                                  struct Curl_easy *data,
                                  const char *buf, size_t blen)
{
  struct stream_ctx *stream = H2_STREAM_CTX(data);
  ssize_t nwritten;
  CURLcode result;

  (void)cf;
  nwritten = Curl_bufq_write(&stream->recvbuf,
                             (const unsigned char *)buf, blen, &result);
  if(nwritten < 0)
    return result;
  stream->resp_hds_len += (size_t)nwritten;
  DEBUGASSERT((size_t)nwritten == blen);
  return CURLE_OK;
}